

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_unpackhi_s8_s16(c_v64 a)

{
  c_v64 cVar1;
  int endian;
  c_v64 a_local;
  c_v64 t;
  
  a_local.u8[7] = a.u8[7];
  a_local.u8[6] = a.u8[6];
  a_local.u8[5] = a.u8[5];
  a_local.u8[4] = a.u8[4];
  cVar1.u16[1] = (short)a_local.s8[5];
  cVar1.u16[0] = (short)a_local.s8[4];
  cVar1.u16[2] = (short)a_local.s8[6];
  cVar1.u16[3] = (short)a_local.s8[7];
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_unpackhi_s8_s16(c_v64 a) {
  c_v64 t;
  int endian = !!CONFIG_BIG_ENDIAN * 4;
  t.s16[3] = (int16_t)a.s8[7 - endian];
  t.s16[2] = (int16_t)a.s8[6 - endian];
  t.s16[1] = (int16_t)a.s8[5 - endian];
  t.s16[0] = (int16_t)a.s8[4 - endian];
  return t;
}